

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

char * __thiscall
CVmObjBigNum::explicit_to_string
          (CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *new_str,int radix,int flags)

{
  int iVar1;
  char *pcVar2;
  int in_ECX;
  uint in_R8D;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000040;
  ulong in_stack_00000048;
  vm_val_t *in_stack_00000050;
  int in_stack_0000014c;
  vm_val_t *in_stack_00000150;
  vm_obj_id_t in_stack_0000015c;
  CVmObjBigNum *in_stack_00000160;
  
  if (((in_ECX == 10) || (iVar1 = is_frac_zero((char *)CONCAT44(in_ECX,in_R8D)), iVar1 == 0)) &&
     ((in_R8D & 2) == 0)) {
    pcVar2 = cvt_to_string(self,new_str,(char *)CONCAT44(radix,flags),in_stack_0000001c,
                           in_stack_00000018,in_stack_00000014,in_stack_00000040,in_stack_00000048,
                           in_stack_00000050);
    return pcVar2;
  }
  pcVar2 = cvt_to_string_in_radix
                     (in_stack_00000160,in_stack_0000015c,in_stack_00000150,in_stack_0000014c);
  return pcVar2;
}

Assistant:

const char *CVmObjBigNum::explicit_to_string(
    VMG_ vm_obj_id_t self, vm_val_t *new_str, int radix, int flags) const
{
    /*
     *   If they want a non-decimal conversion, and we're a whole integer
     *   without a fractional part, generate the integer representation in
     *   the given radix.  If we have a fractional part, or the requested
     *   radix is decimal, use the floating-point formatter instead.
     *   
     *   Also use an integer conversion if we've been specfically asked for
     *   an integer conversion.  
     */
    if ((radix != 10 && is_frac_zero(ext_))
        || (flags & TOSTR_ROUND) != 0)
    {
        /* 
         *   it's all integer, and we have a non-decimal radix - format as an
         *   integer 
         */
        return cvt_to_string_in_radix(vmg_ self, new_str, radix);
    }
    else
    {   
        /* 
         *   no radix, or we have a fraction - use the basic floating-point
         *   formatter with default options 
         */
        return cvt_to_string(vmg_ self, new_str, ext_, 100, -1, -1, -1, 0, 0);
    }
}